

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

int __thiscall CRegexParser::parse_int(CRegexParser *this,utf8_ptr *p,size_t *chrem)

{
  byte bVar1;
  wchar_t wVar2;
  int iVar3;
  
  iVar3 = -1;
  if ((*chrem != 0) &&
     (wVar2 = utf8_ptr::s_getch(p->p_), 0xfffffff5 < (uint)(wVar2 + L'\xffffffc6'))) {
    if (*chrem == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      do {
        wVar2 = utf8_ptr::s_getch(p->p_);
        if ((uint)(wVar2 + L'\xffffffc6') < 0xfffffff6) {
          return iVar3;
        }
        wVar2 = utf8_ptr::s_getch(p->p_);
        iVar3 = wVar2 + iVar3 * 10 + -0x30;
        bVar1 = *p->p_;
        p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
        *chrem = *chrem - 1;
      } while (*chrem != 0);
    }
  }
  return iVar3;
}

Assistant:

int CRegexParser::parse_int(utf8_ptr *p, size_t *chrem)
{
    /* if it's not a number to start with, simply return -1 */
    if (*chrem == 0 || !is_digit(p->getch()))
        return -1;
    
    /* keep going as long as we find digits */
    int acc;
    for (acc = 0 ; *chrem > 0 && is_digit(p->getch()) ; p->inc(), --*chrem)
    {
        /* add this digit into the accumulator */
        acc *= 10;
        acc += value_of_digit(p->getch());
    }

    /* return the accumulated result */
    return acc;
}